

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O2

int __thiscall QtMWidgets::BusyIndicatorPrivate::init(BusyIndicatorPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  QVariantAnimation *pQVar3;
  QPalette *this_00;
  QColor *pQVar4;
  code *local_40 [4];
  Object local_20 [8];
  
  pQVar3 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar3,(QObject *)this->q);
  this->animation = pQVar3;
  QVariant::QVariant((QVariant *)local_40,0.0);
  QVariantAnimation::setStartValue((QVariant *)pQVar3);
  QVariant::~QVariant((QVariant *)local_40);
  pQVar3 = this->animation;
  QVariant::QVariant((QVariant *)local_40,359.0);
  QVariantAnimation::setEndValue((QVariant *)pQVar3);
  QVariant::~QVariant((QVariant *)local_40);
  QVariantAnimation::setDuration((int)this->animation);
  QAbstractAnimation::setLoopCount((int)this->animation);
  local_40[0] = BusyIndicator::_q_update;
  local_40[1] = (code *)0x0;
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::BusyIndicator::*)(QVariant_const&)>
            (local_20,(offset_in_QVariantAnimation_to_subr)this->animation,
             (Object *)QVariantAnimation::valueChanged,0,(ConnectionType)this->q);
  QMetaObject::Connection::~Connection((Connection *)local_20);
  this_00 = (QPalette *)QWidget::palette();
  pQVar4 = QPalette::color(this_00,Highlight);
  uVar1 = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->color = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->color).ct + 2) = uVar1;
  iVar2 = QAbstractAnimation::start(this->animation,0);
  return iVar2;
}

Assistant:

void
BusyIndicatorPrivate::init()
{
	animation = new QVariantAnimation( q );
	animation->setStartValue( 0.0 );
	animation->setEndValue( 359.0 );
	animation->setDuration( 1000 );
	animation->setLoopCount( -1 );

	QObject::connect( animation, &QVariantAnimation::valueChanged,
		q, &BusyIndicator::_q_update );

	color = q->palette().color( QPalette::Highlight );

	animation->start();
}